

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiViewportP * ImGui::FindHoveredViewportFromPlatformWindowStack(ImVec2 *mouse_platform_pos)

{
  ImGuiViewportP *this;
  bool bVar1;
  ImGuiViewportP **ppIVar2;
  ImVector<ImGuiViewportP_*> *this_00;
  ImGuiViewportP *pIVar3;
  int n;
  int i;
  ImRect local_40;
  
  this_00 = &GImGui->Viewports;
  pIVar3 = (ImGuiViewportP *)0x0;
  for (i = 0; i < this_00->Size; i = i + 1) {
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](this_00,i);
    this = *ppIVar2;
    if (((this->super_ImGuiViewport).Flags & 0x480) == 0) {
      local_40 = ImGuiViewportP::GetMainRect(this);
      bVar1 = ImRect::Contains(&local_40,mouse_platform_pos);
      if ((bVar1) &&
         ((pIVar3 == (ImGuiViewportP *)0x0 ||
          (pIVar3->LastFrontMostStampCount < this->LastFrontMostStampCount)))) {
        pIVar3 = this;
      }
    }
  }
  return pIVar3;
}

Assistant:

ImGuiViewportP* ImGui::FindHoveredViewportFromPlatformWindowStack(const ImVec2& mouse_platform_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* best_candidate = NULL;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        if (!(viewport->Flags & (ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_Minimized)) && viewport->GetMainRect().Contains(mouse_platform_pos))
            if (best_candidate == NULL || best_candidate->LastFrontMostStampCount < viewport->LastFrontMostStampCount)
                best_candidate = viewport;
    }
    return best_candidate;
}